

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O1

void __thiscall antlr::ASTFactory::makeASTRoot(ASTFactory *this,ASTPair *currentAST,RefAST *root)

{
  ASTRef *pAVar1;
  AST *pAVar2;
  ASTRefCount<antlr::AST> local_18;
  
  pAVar1 = root->ref;
  if ((pAVar1 != (ASTRef *)0x0) && (pAVar1->ptr != (AST *)0x0)) {
    if (pAVar1 == (ASTRef *)0x0) {
      pAVar2 = (AST *)0x0;
    }
    else {
      pAVar2 = pAVar1->ptr;
    }
    local_18.ref = (currentAST->root).ref;
    if (local_18.ref == (ASTRef *)0x0) {
      local_18.ref = (ASTRef *)0x0;
    }
    else {
      (local_18.ref)->count = (local_18.ref)->count + 1;
    }
    (*pAVar2->_vptr_AST[0xb])();
    ASTRefCount<antlr::AST>::~ASTRefCount(&local_18);
    ASTRefCount<antlr::AST>::operator=(&currentAST->child,&currentAST->root);
    ASTPair::advanceChildToEnd(currentAST);
    ASTRefCount<antlr::AST>::operator=(&currentAST->root,root);
  }
  return;
}

Assistant:

void ASTFactory::setMaxNodeType( int type )
{
	if( nodeFactories.size() < (static_cast<unsigned int>(type)+1) )
		nodeFactories.resize( type+1, &default_factory_descriptor );
}